

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

CoverpointSymbol *
slang::ast::CoverpointSymbol::fromImplicit(Scope *scope,IdentifierNameSyntax *syntax)

{
  undefined1 *puVar1;
  Compilation *args;
  CoverpointSymbol *pCVar2;
  ImplicitTypeSyntax *pIVar3;
  SourceLocation loc;
  SourceLocation local_38;
  string_view local_30;
  
  local_38 = parsing::Token::location(&syntax->identifier);
  args = scope->compilation;
  local_30 = parsing::Token::valueText(&syntax->identifier);
  pCVar2 = BumpAllocator::
           emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&>
                     (&args->super_BumpAllocator,args,&local_30,&local_38);
  pCVar2->isImplicit = true;
  pIVar3 = Compilation::createEmptyTypeSyntax(args,local_38);
  (pCVar2->declaredType).typeOrLink.typeSyntax = &pIVar3->super_DataTypeSyntax;
  puVar1 = &(pCVar2->declaredType).field_0x3f;
  *puVar1 = *puVar1 & 0x7f;
  (pCVar2->declaredType).initializerSyntax = (ExpressionSyntax *)syntax;
  (pCVar2->declaredType).initializerLocation = local_38;
  return pCVar2;
}

Assistant:

CoverpointSymbol& CoverpointSymbol::fromImplicit(const Scope& scope,
                                                 const IdentifierNameSyntax& syntax) {
    auto loc = syntax.identifier.location();
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverpointSymbol>(comp, syntax.identifier.valueText(), loc);

    result->isImplicit = true;
    result->declaredType.setTypeSyntax(comp.createEmptyTypeSyntax(loc));
    result->declaredType.setInitializerSyntax(syntax, loc);
    return *result;
}